

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
BasicBlock::InsertInstrBefore(BasicBlock *this,Instr *newInstr,Instr *beforeThisInstr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  bool local_31;
  Instr *beforeThisInstr_local;
  Instr *newInstr_local;
  BasicBlock *this_local;
  
  bVar2 = Contains(this,beforeThisInstr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd98,"(this->Contains(beforeThisInstr))","this->Contains(beforeThisInstr)")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IR::Instr::InsertBefore(beforeThisInstr,newInstr);
  pIVar5 = GetFirstInstr(this);
  if (pIVar5 == beforeThisInstr) {
    IVar3 = IR::Instr::GetKind(beforeThisInstr);
    local_31 = true;
    if (IVar3 != InstrKindLabel) {
      local_31 = IR::Instr::IsProfiledLabelInstr(beforeThisInstr);
    }
    if (local_31 != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xd9d,"(!beforeThisInstr->IsLabelInstr())",
                         "!beforeThisInstr->IsLabelInstr()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    SetFirstInstr(this,newInstr);
  }
  return;
}

Assistant:

void
BasicBlock::InsertInstrBefore(IR::Instr *newInstr, IR::Instr *beforeThisInstr)
{
    Assert(this->Contains(beforeThisInstr));
    beforeThisInstr->InsertBefore(newInstr);

    if(this->GetFirstInstr() == beforeThisInstr)
    {
        Assert(!beforeThisInstr->IsLabelInstr());
        this->SetFirstInstr(newInstr);
    }
}